

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

fdb_seqnum_t fdb_kvs_get_seqnum(filemgr *file,fdb_kvs_id_t id)

{
  fdb_seqnum_t fVar1;
  
  if (id != 0) {
    fVar1 = _fdb_kvs_get_seqnum(file->kv_header,id);
    return fVar1;
  }
  return (file->header).seqnum.super___atomic_base<unsigned_long>._M_i;
}

Assistant:

fdb_seqnum_t _fdb_kvs_get_seqnum(struct kvs_header *kv_header,
                                 fdb_kvs_id_t id)
{
    fdb_seqnum_t seqnum;
    struct kvs_node query, *node;
    struct avl_node *a;

    spin_lock(&kv_header->lock);
    query.id = id;
    a = avl_search(kv_header->idx_id, &query.avl_id, _kvs_stat_cmp);
    if (a) {
        node = _get_entry(a, struct kvs_node, avl_id);
        seqnum = node->seqnum;
    } else {
        // not existing KV ID.
        // this is necessary for _fdb_restore_wal()
        // not to restore documents in deleted KV store.
        seqnum = 0;
    }
    spin_unlock(&kv_header->lock);

    return seqnum;
}